

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall Socket_TCP_Test::TestBody(Socket_TCP_Test *this)

{
  SocketInterface<socketsys::UnixProvider> local_14;
  Socket_TCP_Test *pSStack_10;
  Socket socket;
  Socket_TCP_Test *this_local;
  
  pSStack_10 = this;
  socketsys::SocketInterface<socketsys::UnixProvider>::SocketInterface(&local_14,IPV4,TCP);
  socketsys::SocketInterface<socketsys::UnixProvider>::setTcpNoDelay(&local_14,true);
  socketsys::SocketInterface<socketsys::UnixProvider>::setSoReuseAddress(&local_14,false);
  socketsys::SocketInterface<socketsys::UnixProvider>::setSoLinger(&local_14,false,0);
  socketsys::SocketInterface<socketsys::UnixProvider>::setSoReceiveTimeout(&local_14,100);
  socketsys::SocketInterface<socketsys::UnixProvider>::setSoSendTimeout(&local_14,100);
  socketsys::SocketInterface<socketsys::UnixProvider>::setSoSendBufferSize(&local_14,100);
  socketsys::SocketInterface<socketsys::UnixProvider>::setSoReceiveBufferSize(&local_14,100);
  socketsys::SocketInterface<socketsys::UnixProvider>::setSoKeepAlive(&local_14,true);
  socketsys::SocketInterface<socketsys::UnixProvider>::~SocketInterface(&local_14);
  return;
}

Assistant:

TEST(Socket, TCP) {
    Socket socket(AddressFamily::IPV4, SocketProtocol::TCP);
    socket.setTcpNoDelay(true);
    socket.setSoReuseAddress(false);
    socket.setSoLinger(false, 0);
    socket.setSoReceiveTimeout(100);
    socket.setSoSendTimeout(100);
    socket.setSoSendBufferSize(100);
    socket.setSoReceiveBufferSize(100);
    socket.setSoKeepAlive(true);
}